

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

var __thiscall
cs::method_import_as::get_namespace(method_import_as *this,context_t *context,iterator it)

{
  bool bVar1;
  int iVar2;
  signal_types sVar3;
  token_base **pptVar4;
  undefined8 uVar5;
  string *str;
  method_import_as *in_RDX;
  iterator in_RSI;
  proxy *in_RDI;
  token_base *id;
  var *ext;
  var_id *package_name;
  token_base *token;
  string *in_stack_00000608;
  string *in_stack_00000610;
  instance_type *in_stack_00000618;
  var_id *in_stack_fffffffffffffe68;
  compile_error *in_stack_fffffffffffffe70;
  compile_error *this_00;
  type_info *in_stack_fffffffffffffe78;
  type_info *in_stack_fffffffffffffe80;
  allocator *paVar6;
  iterator *in_stack_fffffffffffffeb0;
  iterator *in_stack_fffffffffffffeb8;
  any *in_stack_fffffffffffffef0;
  undefined1 local_e9 [39];
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [38];
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  tree_node *local_78;
  token_id *local_70;
  tree_node *local_68;
  undefined1 local_60 [8];
  undefined1 *local_58;
  var_id *local_30;
  token_id *this_01;
  
  pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffeb0);
  this_01 = (token_id *)*pptVar4;
  if (this_01 == (token_id *)0x0) {
    memset(in_RDI,0,8);
    cs_impl::any::any((any *)in_RDI);
  }
  else {
    iVar2 = (*(this_01->super_token_base)._vptr_token_base[2])();
    if (iVar2 != 4) {
      iVar2 = (*(this_01->super_token_base)._vptr_token_base[2])();
      if ((iVar2 != 3) || (sVar3 = token_signal::get_signal((token_signal *)this_01), sVar3 != dot_)
         ) {
        str = (string *)__cxa_allocate_exception(0x28);
        this_00 = (compile_error *)local_e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_e9 + 1),
                   "Wrong grammar for import-as statement, expect <package name> or <package name>.<namespace id>..."
                   ,(allocator *)this_00);
        compile_error::compile_error(this_00,str);
        __cxa_throw(str,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_68 = (tree_node *)tree_type<cs::token_base_*>::iterator::left(in_stack_fffffffffffffeb8)
      ;
      get_namespace(in_RDX,(context_t *)this_01,in_RSI);
      local_58 = local_60;
      local_78 = (tree_node *)
                 tree_type<cs::token_base_*>::iterator::right(in_stack_fffffffffffffeb8);
      pptVar4 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffeb0);
      local_70 = (token_id *)*pptVar4;
      if ((local_70 != (token_id *)0x0) &&
         (iVar2 = (*(local_70->super_token_base)._vptr_token_base[2])(), iVar2 == 4)) {
        cs_impl::any::type((any *)in_stack_fffffffffffffe70);
        bVar1 = std::type_info::operator==(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        if (bVar1) {
          cs_impl::any::const_val<std::shared_ptr<cs::name_space>>(in_stack_fffffffffffffef0);
          std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b29fc);
          token_id::get_id(local_70);
          name_space::get_var((name_space *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          cs_impl::any::any((any *)in_stack_fffffffffffffe70,(any *)in_stack_fffffffffffffe68);
          cs_impl::any::~any((any *)0x1b2a43);
          return (var)in_RDI;
        }
        local_c2 = 1;
        uVar5 = __cxa_allocate_exception(0x28);
        paVar6 = &local_c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c0,"Access non-namespace object.",paVar6);
        compile_error::compile_error(in_stack_fffffffffffffe70,(string *)in_stack_fffffffffffffe68);
        local_c2 = 0;
        __cxa_throw(uVar5,&compile_error::typeinfo,compile_error::~compile_error);
      }
      local_9a = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      paVar6 = &local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_98,
                 "Wrong grammar for import-as statement, expect <package name> or <package name>.<namespace id>..."
                 ,paVar6);
      compile_error::compile_error(in_stack_fffffffffffffe70,(string *)in_stack_fffffffffffffe68);
      local_9a = 0;
      __cxa_throw(uVar5,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_30 = token_id::get_id(this_01);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b272c);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b2738);
    var_id::operator_cast_to_string_(local_30);
    instance_type::import(in_stack_00000618,in_stack_00000610,in_stack_00000608);
    make_namespace((namespace_t *)in_stack_fffffffffffffe68);
    std::shared_ptr<cs::name_space>::~shared_ptr((shared_ptr<cs::name_space> *)0x1b27a9);
  }
  return (var)in_RDI;
}

Assistant:

var method_import_as::get_namespace(const context_t &context, tree_type<token_base *>::iterator it)
	{
		token_base *token = it.data();
		if (token == nullptr)
			return var();
		if (token->get_type() == token_types::id) {
			const var_id &package_name = static_cast<token_id *>(token)->get_id();
			return make_namespace(context->instance->import(current_process->import_path, package_name));
		}
		else if (token->get_type() == token_types::signal &&
		         static_cast<token_signal *>(token)->get_signal() == signal_types::dot_) {
			const var &ext = get_namespace(context, it.left());
			token_base *id = it.right().data();
			if (id == nullptr || id->get_type() != token_types::id)
				throw compile_error(
				    "Wrong grammar for import-as statement, expect <package name> or <package name>.<namespace id>...");
			if (ext.type() == typeid(namespace_t))
				return ext.const_val<namespace_t>()->get_var(static_cast<token_id *>(id)->get_id());
			else
				throw compile_error("Access non-namespace object.");
		}
		else
			throw compile_error(
			    "Wrong grammar for import-as statement, expect <package name> or <package name>.<namespace id>...");
	}